

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleResetAllDirective(Preprocessor *this,Token directive)

{
  Trivia TVar1;
  
  checkOutsideDesignElement(this,directive);
  if ((this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged == true) {
    (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
    super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  }
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  resetProtectState(this);
  TVar1 = createSimpleDirective(this,directive);
  TVar1._8_8_ = TVar1._8_8_ & 0xffffffffffff;
  return TVar1;
}

Assistant:

Trivia Preprocessor::handleResetAllDirective(Token directive) {
    checkOutsideDesignElement(directive);
    resetAllDirectives();
    return createSimpleDirective(directive);
}